

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::LineTable>::mapping(IO *IO,LineTable *LineTable)

{
  EmptyContext local_25;
  EmptyContext local_24;
  EmptyContext local_23;
  EmptyContext local_22;
  EmptyContext local_21;
  EmptyContext local_20;
  EmptyContext local_1f;
  EmptyContext local_1e;
  EmptyContext Ctx_12;
  EmptyContext Ctx_11;
  EmptyContext Ctx_10;
  EmptyContext Ctx_9;
  EmptyContext Ctx_8;
  EmptyContext Ctx_7;
  EmptyContext Ctx_6;
  EmptyContext Ctx_5;
  EmptyContext Ctx_4;
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
            (IO,"Length",&LineTable->Length,true,&Ctx_8);
  yaml::IO::processKey<unsigned_short,llvm::yaml::EmptyContext>
            (IO,"Version",&LineTable->Version,true,&Ctx_9);
  yaml::IO::processKey<unsigned_long,llvm::yaml::EmptyContext>
            (IO,"PrologueLength",&LineTable->PrologueLength,true,&Ctx_10);
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"MinInstLength",&LineTable->MinInstLength,true,&Ctx_11);
  if (3 < LineTable->Version) {
    yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
              (IO,"MaxOpsPerInst",&LineTable->MaxOpsPerInst,true,&Ctx_12);
  }
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"DefaultIsStmt",&LineTable->DefaultIsStmt,true,&local_1e);
  yaml::IO::processKey<signed_char,llvm::yaml::EmptyContext>
            (IO,"LineBase",&LineTable->LineBase,true,&local_1f);
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"LineRange",&LineTable->LineRange,true,&local_20);
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"OpcodeBase",&LineTable->OpcodeBase,true,&local_21);
  yaml::IO::
  processKey<std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::yaml::EmptyContext>
            (IO,"StandardOpcodeLengths",&LineTable->StandardOpcodeLengths,true,&local_22);
  yaml::IO::
  processKey<std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>,llvm::yaml::EmptyContext>
            (IO,"IncludeDirs",&LineTable->IncludeDirs,true,&local_23);
  yaml::IO::
  processKey<std::vector<llvm::DWARFYAML::File,std::allocator<llvm::DWARFYAML::File>>,llvm::yaml::EmptyContext>
            (IO,"Files",&LineTable->Files,true,&local_24);
  yaml::IO::
  processKey<std::vector<llvm::DWARFYAML::LineTableOpcode,std::allocator<llvm::DWARFYAML::LineTableOpcode>>,llvm::yaml::EmptyContext>
            (IO,"Opcodes",&LineTable->Opcodes,true,&local_25);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::LineTable>::mapping(
    IO &IO, DWARFYAML::LineTable &LineTable) {
  IO.mapRequired("Length", LineTable.Length);
  IO.mapRequired("Version", LineTable.Version);
  IO.mapRequired("PrologueLength", LineTable.PrologueLength);
  IO.mapRequired("MinInstLength", LineTable.MinInstLength);
  if(LineTable.Version >= 4)
    IO.mapRequired("MaxOpsPerInst", LineTable.MaxOpsPerInst);
  IO.mapRequired("DefaultIsStmt", LineTable.DefaultIsStmt);
  IO.mapRequired("LineBase", LineTable.LineBase);
  IO.mapRequired("LineRange", LineTable.LineRange);
  IO.mapRequired("OpcodeBase", LineTable.OpcodeBase);
  IO.mapRequired("StandardOpcodeLengths", LineTable.StandardOpcodeLengths);
  IO.mapRequired("IncludeDirs", LineTable.IncludeDirs);
  IO.mapRequired("Files", LineTable.Files);
  IO.mapRequired("Opcodes", LineTable.Opcodes);
}